

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall
Alg::opimb_fast_approx
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double epsilon,double feps,double delta,int mode)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  ResultInfo *this_00;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  size_type sVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double approxOPIMC;
  double upperOPT;
  double lowerSelect;
  double upperDegOPT;
  double upperBound_med;
  double upperBound;
  double degVldt;
  double infVldt;
  double infSelf;
  size_t numR;
  size_t idx;
  double dStack_100;
  int satisfy_count;
  double timeb;
  double time2;
  double time1;
  double a2;
  double a1;
  size_t numIter;
  size_t theta_max;
  size_t theta_zero;
  int local_a8;
  int k_min;
  vector<double,_std::allocator<double>_> local_98;
  int local_7c;
  double dStack_78;
  int k_max;
  double alpha;
  double approx;
  Timer timerOPIMC;
  int mode_local;
  double delta_local;
  double feps_local;
  double epsilon_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  double budget_local;
  Graph *graph_local;
  Alg *this_local;
  
  timerOPIMC.__processName._4_4_ = mode;
  Timer::Timer((Timer *)&approx,"OPIM-B-FAST-APPORX");
  alpha = epsilon;
  poVar6 = std::operator<<((ostream *)&std::cout,"Approx: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,alpha);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  dVar10 = log(6.0 / delta);
  dStack_78 = sqrt(dVar10);
  std::vector<double,_std::allocator<double>_>::vector(&local_98,budget_list);
  iVar5 = cal_k_max(&local_98,budget);
  std::vector<double,_std::allocator<double>_>::~vector(&local_98);
  local_7c = iVar5;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&theta_zero,budget_list);
  iVar5 = cal_k_min((vector<double,_std::allocator<double>_> *)&theta_zero,budget);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&theta_zero);
  dVar14 = alpha;
  dVar10 = dStack_78;
  dVar11 = (double)this->__numV;
  dVar17 = (double)local_7c;
  local_a8 = iVar5;
  dVar12 = log(dVar11);
  dVar13 = log(6.0 / delta);
  dVar12 = sqrt(dVar14 * (dVar17 * dVar12 + dVar13));
  dVar12 = pow2(dVar14 * dVar10 + dVar12);
  dVar14 = alpha;
  dVar10 = dStack_78;
  dVar11 = ((dVar11 + dVar11) * dVar12) / (double)this->__numV;
  uVar9 = (ulong)dVar11;
  theta_max = uVar9 | (long)(dVar11 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f;
  dVar11 = (double)this->__numV;
  dVar17 = (double)local_7c;
  dVar12 = log(dVar11);
  dVar13 = log(6.0 / delta);
  dVar12 = sqrt(dVar14 * (dVar17 * dVar12 + dVar13));
  dVar10 = pow2(dVar14 * dVar10 + dVar12);
  dVar14 = pow2(epsilon);
  dVar10 = ((dVar11 + dVar11) * dVar10) / (dVar14 * (double)local_7c);
  uVar9 = (ulong)dVar10;
  dVar10 = dVar10 - 9.223372036854776e+18;
  numIter = uVar9 | (long)dVar10 & (long)uVar9 >> 0x3f;
  dVar10 = log2(dVar10);
  a1 = (double)(((long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f) + 1);
  auVar15._8_4_ = (int)((ulong)a1 >> 0x20);
  auVar15._0_8_ = a1;
  auVar15._12_4_ = 0x45300000;
  a2 = log((((auVar15._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(a1,0)) - 4503599627370496.0)) * 3.0) / delta);
  auVar16._8_4_ = (int)((ulong)a1 >> 0x20);
  auVar16._0_8_ = a1;
  auVar16._12_4_ = 0x45300000;
  time1 = log((((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,SUB84(a1,0)) - 4503599627370496.0)) * 3.0) / delta);
  time2 = 0.0;
  timeb = 0.0;
  dStack_100 = 0.0;
  bVar4 = false;
  numR = 0;
  while( true ) {
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,numR);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    sVar7 = theta_max << ((byte)numR & 0x3f);
    Timer::get_operation_time((Timer *)&approx);
    HyperGraph::build_n_RRsets(&this->__hyperG,sVar7);
    HyperGraph::build_n_RRsets(&this->__hyperGVldt,sVar7);
    poVar6 = std::operator<<((ostream *)&std::cout,"# RR sets: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    sVar7 = HyperGraph::get_RR_sets_size(&this->__hyperG);
    this->__numRRsets = sVar7;
    dVar10 = Timer::get_operation_time((Timer *)&approx);
    time2 = time2 + dVar10;
    dVar10 = max_cover_budget_fast_end
                       (this,graph,budget,budget_list,feps,&stack0xffffffffffffff00,
                        timerOPIMC.__processName._4_4_);
    dVar14 = Timer::get_operation_time((Timer *)&approx);
    timeb = timeb + dVar14;
    dVar14 = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
    sVar7 = this->__numRRsets;
    auVar18._8_4_ = (int)(sVar7 >> 0x20);
    auVar18._0_8_ = sVar7;
    auVar18._12_4_ = 0x45300000;
    uVar2 = this->__numV;
    dVar11 = dVar10 / alpha;
    if (timerOPIMC.__processName._4_4_ == 1) {
      upperBound_med = max_element(this->__boundLast_inf,this->__boundLast_inf_cost);
    }
    else {
      upperBound_med = dVar10;
      if (timerOPIMC.__processName._4_4_ == 2) {
        if ((this->__is_inf_cost & 1U) == 0) {
          upperBound_med = this->__boundMin_inf;
        }
        else {
          upperBound_med = min_bound(this->__boundMin_inf_cost,dVar11);
        }
      }
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"========upper bound ratio: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,upperBound_med / dVar11);
    poVar6 = std::operator<<(poVar6,"========");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    sVar1 = this->__numRRsets;
    auVar19._8_4_ = (int)(sVar1 >> 0x20);
    auVar19._0_8_ = sVar1;
    auVar19._12_4_ = 0x45300000;
    uVar3 = this->__numV;
    dVar11 = sqrt((dVar14 * ((auVar18._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0))) /
                  (double)uVar2 + (a2 * 2.0) / 9.0);
    dVar12 = sqrt(a2 / 2.0);
    dVar11 = pow2(dVar11 - dVar12);
    upperOPT = dVar11 - a2 / 18.0;
    if (upperOPT < 0.0) {
      upperOPT = 0.0;
    }
    dVar11 = sqrt((upperBound_med *
                  ((auVar19._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) / (double)uVar3 +
                  time1 / 2.0);
    dVar12 = sqrt(time1 / 2.0);
    dVar11 = pow2(dVar11 + dVar12);
    dVar11 = upperOPT / dVar11;
    poVar6 = std::operator<<((ostream *)&std::cout," -->OPIM-B-FAST-APPROX (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,numR + 1);
    poVar6 = std::operator<<(poVar6,"/");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)a1);
    poVar6 = std::operator<<(poVar6,") approx. (max-cover): ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar11);
    poVar6 = std::operator<<(poVar6," (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar10 / upperBound_med);
    poVar6 = std::operator<<(poVar6,"), #RR sets: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->__numRRsets);
    std::operator<<(poVar6,'\n');
    if ((alpha <= dVar11) && (bVar4)) break;
    if ((alpha <= dVar11) && (!bVar4)) {
      bVar4 = true;
    }
    numR = numR + 1;
  }
  ResultInfo::set_approximation(this->__tRes,dVar11);
  this_00 = this->__tRes;
  dVar11 = Timer::get_total_time((Timer *)&approx);
  ResultInfo::set_running_time(this_00,dVar11);
  ResultInfo::set_influence(this->__tRes,dVar14);
  ResultInfo::set_influence_original(this->__tRes,dVar10);
  ResultInfo::set_seed_vec(this->__tRes,&this->__vecSeed);
  ResultInfo::set_seed_inf_vec(this->__tRes,&this->__vecSeed_inf);
  ResultInfo::set_seed_inf_cost_vec(this->__tRes,&this->__vecSeed_inf_cost);
  ResultInfo::set_boundmin_inf(this->__tRes,this->__boundMin_inf);
  ResultInfo::set_boundmin_inf_cost(this->__tRes,this->__boundMin_inf_cost);
  ResultInfo::set_RR_sets_size(this->__tRes,this->__numRRsets << 1);
  poVar6 = std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar14);
  poVar6 = std::operator<<(poVar6,", time: ");
  dVar10 = ResultInfo::get_running_time(this->__tRes);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar10);
  std::operator<<(poVar6,'\n');
  poVar6 = std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,time2);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,timeb - dStack_100);
  std::operator<<(poVar6,'\n');
  poVar6 = std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dStack_100);
  std::operator<<(poVar6,'\n');
  poVar6 = std::operator<<((ostream *)&std::cout,"Seed size: ");
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return 0.0;
}

Assistant:

double Alg::opimb_fast_approx(const Graph & graph, const double budget, const std::vector<double> & budget_list,
                           const double epsilon, const double feps, const double delta, const int mode) {
    Timer timerOPIMC("OPIM-B-FAST-APPORX");
    const double approx = epsilon;
    std::cout << "Approx: " << approx << std::endl;
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2(approx * alpha
            + sqrt(approx * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2(approx * alpha
            + sqrt(approx * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    int satisfy_count = 0;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget_fast_end(graph, budget, budget_list, feps, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf;
        auto upperBound_med = infSelf / approx;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        std::cout << "========upper bound ratio: " << upperBound / upperBound_med << "========" << std::endl;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-FAST-APPROX (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            std::cout << "Seed size: " << __vecSeed.size() << std::endl;
            return 0;
        }
        else if (approxOPIMC >= approx && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}